

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void armci_msg_bintree(int scope,int *Root,int *Up,int *Left,int *Right)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (scope == 0x153) {
    __assert_fail("SCOPE_MASTERS != scope",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x224,"void armci_msg_bintree(int, int *, int *, int *, int *)");
  }
  if (scope != 0x151) {
    iVar1 = armci_msg_nproc();
    iVar2 = armci_msg_me();
    iVar4 = -1;
    iVar3 = (iVar2 + -1) / 2;
    if (iVar2 < 0) {
      iVar3 = iVar4;
    }
    iVar5 = iVar2 * 2 + 1;
    if (iVar1 <= iVar5) {
      iVar5 = iVar4;
    }
    iVar2 = iVar2 * 2 + 2;
    if (iVar2 < iVar1) {
      iVar4 = iVar2;
    }
    *Up = iVar3;
    *Left = iVar5;
    *Right = iVar4;
    *Root = 0;
    return;
  }
  __assert_fail("SCOPE_NODE != scope",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                ,0x223,"void armci_msg_bintree(int, int *, int *, int *, int *)");
}

Assistant:

void armci_msg_bintree(int scope, int* Root, int *Up, int *Left, int *Right)
{
    int root, up, left, right, index, nproc;

    assert(SCOPE_NODE != scope);
    assert(SCOPE_MASTERS != scope);

    root  = 0;
    nproc = armci_msg_nproc();
    index = armci_msg_me() - root;
    up    = (index-1)/2 + root; if( up < root) up = -1;
    left  = 2*index + 1 + root; if(left >= root+nproc) left = -1;
    right = 2*index + 2 + root; if(right >= root+nproc)right = -1;

    *Up = up;
    *Left = left;
    *Right = right;
    *Root = root;
}